

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

char * tinyformat::detail::streamStateFromFormat
                 (ostream *out,bool *positionalMode,bool *spacePadPositive,int *ntrunc,
                 char *fmtStart,FormatArg *args,int *argIndex,int numArgs)

{
  char cVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  _Ios_Fmtflags _Var5;
  undefined8 uVar6;
  streamsize sVar7;
  undefined4 *in_RCX;
  undefined1 *in_RDX;
  byte *in_RSI;
  long *in_RDI;
  char *in_R8;
  long in_FS_OFFSET;
  bool bVar8;
  bool bVar9;
  int *in_stack_00000008;
  int in_stack_00000010;
  bool intConversion;
  int value;
  char tmpc;
  int widthExtra;
  bool widthSet;
  bool precisionSet;
  int precision;
  int width;
  char *c;
  _Ios_Fmtflags in_stack_fffffffffffffe38;
  _Ios_Fmtflags in_stack_fffffffffffffe3c;
  fmtflags in_stack_fffffffffffffe40;
  fmtflags in_stack_fffffffffffffe44;
  ios_base *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  char *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  int *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  long in_stack_fffffffffffffea0;
  undefined1 positionalMode_00;
  char **in_stack_fffffffffffffea8;
  int *in_stack_fffffffffffffeb0;
  bool local_f2;
  char *local_b0;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_R8 != '%') {
    __assert_fail("*fmtStart == \'%\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/tinyformat.h"
                  ,0x29a,
                  "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                 );
  }
  std::ios_base::width
            (in_stack_fffffffffffffe48,CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40)
            );
  std::ios_base::precision
            (in_stack_fffffffffffffe48,CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40)
            );
  cVar3 = (char)in_RDI;
  std::ios::fill(cVar3 + (char)*(undefined8 *)(*in_RDI + -0x18));
  std::operator|(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
  std::operator|(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
  std::operator|(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
  std::operator|(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
  std::operator|(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
  std::operator|(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
  std::operator|(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
  std::ios_base::unsetf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
  local_f2 = false;
  local_b0 = in_R8 + 1;
  if ((*local_b0 < '0') || ('9' < *local_b0)) {
    if ((*in_RSI & 1) != 0) {
      uVar6 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      format_error::format_error
                ((format_error *)in_stack_fffffffffffffe48,
                 (string *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        __cxa_throw(uVar6,&format_error::typeinfo,format_error::~format_error);
      }
      goto LAB_00131897;
    }
  }
  else {
    cVar1 = *local_b0;
    iVar4 = parseIntAndAdvance((char **)in_stack_fffffffffffffe48);
    if (*local_b0 == '$') {
      if ((iVar4 < 1) || (in_stack_00000010 < iVar4)) {
        uVar6 = __cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
        ;
        format_error::format_error
                  ((format_error *)in_stack_fffffffffffffe48,
                   (string *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          __cxa_throw(uVar6,&format_error::typeinfo,format_error::~format_error);
        }
        goto LAB_00131897;
      }
      *in_stack_00000008 = iVar4 + -1;
      local_b0 = in_R8 + 2;
      *in_RSI = 1;
    }
    else {
      if ((*in_RSI & 1) != 0) {
        uVar6 = __cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
        ;
        format_error::format_error
                  ((format_error *)in_stack_fffffffffffffe48,
                   (string *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          __cxa_throw(uVar6,&format_error::typeinfo,format_error::~format_error);
        }
        goto LAB_00131897;
      }
      if (cVar1 == '0') {
        std::ios::fill(cVar3 + (char)*(undefined8 *)(*in_RDI + -0x18));
        std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                            in_stack_fffffffffffffe40);
      }
      local_f2 = iVar4 != 0;
      if (local_f2) {
        std::ios_base::width
                  (in_stack_fffffffffffffe48,
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      }
    }
  }
  positionalMode_00 = (undefined1)((ulong)in_stack_fffffffffffffea0 >> 0x38);
  if (local_f2 == false) {
    do {
      positionalMode_00 = (undefined1)((ulong)in_stack_fffffffffffffea0 >> 0x38);
      in_stack_fffffffffffffea8 = (char **)(ulong)((int)*local_b0 - 0x20);
      switch(in_stack_fffffffffffffea8) {
      case (char **)0x0:
        std::ios_base::flags
                  ((ios_base *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        _Var5 = std::operator&(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (_Var5 == ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
          *in_RDX = 1;
        }
        break;
      default:
        goto LAB_001310ef;
      case (char **)0x3:
        in_stack_fffffffffffffea0 = (long)in_RDI + *(long *)(*in_RDI + -0x18);
        std::operator|(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
        break;
      case (char **)0xb:
        std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
        *in_RDX = 0;
        break;
      case (char **)0xd:
        std::ios::fill(cVar3 + (char)*(undefined8 *)(*in_RDI + -0x18));
        std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                            in_stack_fffffffffffffe40);
        break;
      case (char **)0x10:
        std::ios_base::flags
                  ((ios_base *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        _Var5 = std::operator&(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (_Var5 == ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
          std::ios::fill(cVar3 + (char)*(undefined8 *)(*in_RDI + -0x18));
          std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                              in_stack_fffffffffffffe40);
        }
      }
      local_b0 = local_b0 + 1;
    } while( true );
  }
LAB_001311b8:
  bVar8 = *local_b0 == '.';
  if (bVar8) {
    local_b0 = local_b0 + 1;
    parseWidthOrPrecision
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(bool)positionalMode_00,
               (FormatArg *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
               in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    std::ios_base::precision
              (in_stack_fffffffffffffe48,
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  }
  while( true ) {
    bVar9 = true;
    if ((((*local_b0 != 'l') && (bVar9 = true, *local_b0 != 'h')) &&
        (bVar9 = true, *local_b0 != 'L')) &&
       ((bVar9 = true, *local_b0 != 'j' && (bVar9 = true, *local_b0 != 'z')))) {
      bVar9 = *local_b0 == 't';
    }
    if (!bVar9) break;
    local_b0 = local_b0 + 1;
  }
  bVar9 = false;
  switch(*local_b0) {
  case '\0':
    uVar6 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    format_error::format_error
              ((format_error *)in_stack_fffffffffffffe48,
               (string *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      __cxa_throw(uVar6,&format_error::typeinfo,format_error::~format_error);
    }
    goto LAB_00131897;
  default:
    break;
  case 'A':
    std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
  case 'a':
    std::operator|(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
    std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                        in_stack_fffffffffffffe40);
    break;
  case 'E':
    std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
  case 'e':
    std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                        in_stack_fffffffffffffe40);
    std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                        in_stack_fffffffffffffe40);
    break;
  case 'F':
    std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
  case 'f':
    std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                        in_stack_fffffffffffffe40);
    break;
  case 'G':
    std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
  case 'g':
    std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                        in_stack_fffffffffffffe40);
    std::ios_base::flags((ios_base *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::operator~(in_stack_fffffffffffffe3c);
    std::operator&(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
    std::ios_base::flags(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
    break;
  case 'X':
    std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
  case 'p':
  case 'x':
    std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                        in_stack_fffffffffffffe40);
    bVar9 = true;
    break;
  case 'c':
    break;
  case 'd':
  case 'i':
  case 'u':
    std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                        in_stack_fffffffffffffe40);
    bVar9 = true;
    break;
  case 'n':
    uVar6 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    format_error::format_error
              ((format_error *)in_stack_fffffffffffffe48,
               (string *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      __cxa_throw(uVar6,&format_error::typeinfo,format_error::~format_error);
    }
    goto LAB_00131897;
  case 'o':
    std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                        in_stack_fffffffffffffe40);
    bVar9 = true;
    break;
  case 's':
    if (bVar8) {
      sVar7 = std::ios_base::precision
                        ((ios_base *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      *in_RCX = (int)sVar7;
    }
    std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
  }
  if (((bVar9) && (bVar8)) && (local_f2 == false)) {
    std::ios_base::precision
              ((ios_base *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::ios_base::width
              (in_stack_fffffffffffffe48,
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    std::ios_base::setf(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                        in_stack_fffffffffffffe40);
    std::ios::fill(cVar3 + (char)*(undefined8 *)(*in_RDI + -0x18));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_b0 + 1;
  }
LAB_00131897:
  __stack_chk_fail();
LAB_001310ef:
  local_f2 = parseWidthOrPrecision
                       (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(bool)positionalMode_00,
                        (FormatArg *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                        in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  if (local_f2) {
    std::ios_base::width
              (in_stack_fffffffffffffe48,
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  }
  goto LAB_001311b8;
}

Assistant:

inline const char* streamStateFromFormat(std::ostream& out, bool& positionalMode,
                                         bool& spacePadPositive,
                                         int& ntrunc, const char* fmtStart,
                                         const detail::FormatArg* args,
                                         int& argIndex, int numArgs)
{
    TINYFORMAT_ASSERT(*fmtStart == '%');
    // Reset stream state to defaults.
    out.width(0);
    out.precision(6);
    out.fill(' ');
    // Reset most flags; ignore irrelevant unitbuf & skipws.
    out.unsetf(std::ios::adjustfield | std::ios::basefield |
               std::ios::floatfield | std::ios::showbase | std::ios::boolalpha |
               std::ios::showpoint | std::ios::showpos | std::ios::uppercase);
    bool precisionSet = false;
    bool widthSet = false;
    int widthExtra = 0;
    const char* c = fmtStart + 1;

    // 1) Parse an argument index (if followed by '$') or a width possibly
    // preceded with '0' flag.
    if (*c >= '0' && *c <= '9') {
        const char tmpc = *c;
        int value = parseIntAndAdvance(c);
        if (*c == '$') {
            // value is an argument index
            if (value > 0 && value <= numArgs)
                argIndex = value - 1;
            else
                TINYFORMAT_ERROR("tinyformat: Positional argument out of range");
            ++c;
            positionalMode = true;
        }
        else if (positionalMode) {
            TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
        }
        else {
            if (tmpc == '0') {
                // Use internal padding so that numeric values are
                // formatted correctly, eg -00010 rather than 000-10
                out.fill('0');
                out.setf(std::ios::internal, std::ios::adjustfield);
            }
            if (value != 0) {
                // Nonzero value means that we parsed width.
                widthSet = true;
                out.width(value);
            }
        }
    }
    else if (positionalMode) {
        TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
    }
    // 2) Parse flags and width if we did not do it in previous step.
    if (!widthSet) {
        // Parse flags
        for (;; ++c) {
            switch (*c) {
                case '#':
                    out.setf(std::ios::showpoint | std::ios::showbase);
                    continue;
                case '0':
                    // overridden by left alignment ('-' flag)
                    if (!(out.flags() & std::ios::left)) {
                        // Use internal padding so that numeric values are
                        // formatted correctly, eg -00010 rather than 000-10
                        out.fill('0');
                        out.setf(std::ios::internal, std::ios::adjustfield);
                    }
                    continue;
                case '-':
                    out.fill(' ');
                    out.setf(std::ios::left, std::ios::adjustfield);
                    continue;
                case ' ':
                    // overridden by show positive sign, '+' flag.
                    if (!(out.flags() & std::ios::showpos))
                        spacePadPositive = true;
                    continue;
                case '+':
                    out.setf(std::ios::showpos);
                    spacePadPositive = false;
                    widthExtra = 1;
                    continue;
                default:
                    break;
            }
            break;
        }
        // Parse width
        int width = 0;
        widthSet = parseWidthOrPrecision(width, c, positionalMode,
                                         args, argIndex, numArgs);
        if (widthSet) {
            if (width < 0) {
                // negative widths correspond to '-' flag set
                out.fill(' ');
                out.setf(std::ios::left, std::ios::adjustfield);
                width = -width;
            }
            out.width(width);
        }
    }
    // 3) Parse precision
    if (*c == '.') {
        ++c;
        int precision = 0;
        parseWidthOrPrecision(precision, c, positionalMode,
                              args, argIndex, numArgs);
        // Presence of `.` indicates precision set, unless the inferred value
        // was negative in which case the default is used.
        precisionSet = precision >= 0;
        if (precisionSet)
            out.precision(precision);
    }
    // 4) Ignore any C99 length modifier
    while (*c == 'l' || *c == 'h' || *c == 'L' ||
           *c == 'j' || *c == 'z' || *c == 't') {
        ++c;
    }
    // 5) We're up to the conversion specifier character.
    // Set stream flags based on conversion specifier (thanks to the
    // boost::format class for forging the way here).
    bool intConversion = false;
    switch (*c) {
        case 'u': case 'd': case 'i':
            out.setf(std::ios::dec, std::ios::basefield);
            intConversion = true;
            break;
        case 'o':
            out.setf(std::ios::oct, std::ios::basefield);
            intConversion = true;
            break;
        case 'X':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'x': case 'p':
            out.setf(std::ios::hex, std::ios::basefield);
            intConversion = true;
            break;
        case 'E':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'e':
            out.setf(std::ios::scientific, std::ios::floatfield);
            out.setf(std::ios::dec, std::ios::basefield);
            break;
        case 'F':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'f':
            out.setf(std::ios::fixed, std::ios::floatfield);
            break;
        case 'A':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'a':
#           ifdef _MSC_VER
            // Workaround https://developercommunity.visualstudio.com/content/problem/520472/hexfloat-stream-output-does-not-ignore-precision-a.html
            // by always setting maximum precision on MSVC to avoid precision
            // loss for doubles.
            out.precision(13);
#           endif
            out.setf(std::ios::fixed | std::ios::scientific, std::ios::floatfield);
            break;
        case 'G':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'g':
            out.setf(std::ios::dec, std::ios::basefield);
            // As in boost::format, let stream decide float format.
            out.flags(out.flags() & ~std::ios::floatfield);
            break;
        case 'c':
            // Handled as special case inside formatValue()
            break;
        case 's':
            if (precisionSet)
                ntrunc = static_cast<int>(out.precision());
            // Make %s print Booleans as "true" and "false"
            out.setf(std::ios::boolalpha);
            break;
        case 'n':
            // Not supported - will cause problems!
            TINYFORMAT_ERROR("tinyformat: %n conversion spec not supported");
            break;
        case '\0':
            TINYFORMAT_ERROR("tinyformat: Conversion spec incorrectly "
                             "terminated by end of string");
            return c;
        default:
            break;
    }
    if (intConversion && precisionSet && !widthSet) {
        // "precision" for integers gives the minimum number of digits (to be
        // padded with zeros on the left).  This isn't really supported by the
        // iostreams, but we can approximately simulate it with the width if
        // the width isn't otherwise used.
        out.width(out.precision() + widthExtra);
        out.setf(std::ios::internal, std::ios::adjustfield);
        out.fill('0');
    }
    return c+1;
}